

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

void __thiscall tcu::Vector<tcu::Interval,_3>::Vector(Vector<tcu::Interval,_3> *this)

{
  bool *pbVar1;
  long lVar2;
  
  lVar2 = 8;
  do {
    *(undefined1 *)((long)this->m_data + lVar2 + -8) = 0;
    pbVar1 = &this->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x50);
  for (lVar2 = 8; lVar2 != 0x50; lVar2 = lVar2 + 0x18) {
    *(undefined1 *)((long)this->m_data + lVar2 + -8) = 0;
    pbVar1 = &this->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
  }
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}